

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O1

void Fra_ClauReduceClause(Vec_Int_t *vMain,Vec_Int_t *vNew)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  if (vNew->nSize < vMain->nSize) {
    __assert_fail("Vec_IntSize(vMain) <= Vec_IntSize(vNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClau.c"
                  ,0x1dc,"void Fra_ClauReduceClause(Vec_Int_t *, Vec_Int_t *)");
  }
  uVar6 = vMain->nSize;
  if ((int)uVar6 < 1) {
    uVar3 = 0;
    uVar2 = 0;
  }
  else {
    lVar4 = 0;
    uVar2 = 0;
    uVar3 = 0;
    do {
      if (vNew->nSize <= lVar4) break;
      if ((int)uVar3 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = vMain->pArray[uVar3];
      iVar5 = vNew->pArray[lVar4] >> 1;
      if (iVar1 >> 1 < iVar5) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClau.c"
                      ,0x1e5,"void Fra_ClauReduceClause(Vec_Int_t *, Vec_Int_t *)");
      }
      if ((iVar1 >> 1 <= iVar5) && (uVar3 = uVar3 + 1, iVar1 == vNew->pArray[lVar4])) {
        if (((int)uVar2 < 0) || ((int)uVar6 <= (int)uVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar7 = (ulong)uVar2;
        uVar2 = uVar2 + 1;
        vMain->pArray[uVar7] = iVar1;
      }
      lVar4 = lVar4 + 1;
      uVar6 = vMain->nSize;
    } while ((int)uVar3 < (int)uVar6);
  }
  if (uVar3 != uVar6) {
    __assert_fail("i == Vec_IntSize(vMain)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClau.c"
                  ,499,"void Fra_ClauReduceClause(Vec_Int_t *, Vec_Int_t *)");
  }
  if ((int)uVar6 < (int)uVar2) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vMain->nSize = uVar2;
  return;
}

Assistant:

void Fra_ClauReduceClause( Vec_Int_t * vMain, Vec_Int_t * vNew )
{
    int LitM, LitN, VarM, VarN, i, j, k;
    assert( Vec_IntSize(vMain) <= Vec_IntSize(vNew) );
    for ( i = j = k = 0; i < Vec_IntSize(vMain) && j < Vec_IntSize(vNew); )
    {
        LitM = Vec_IntEntry( vMain, i );
        LitN = Vec_IntEntry( vNew, j );
        VarM = lit_var( LitM );
        VarN = lit_var( LitN );
        if ( VarM < VarN )
        {
            assert( 0 );
        }
        else if ( VarM > VarN )
        {
            j++;
        }
        else // if ( VarM == VarN )
        {
            i++;
            j++;
            if ( LitM == LitN )
                Vec_IntWriteEntry( vMain, k++, LitM );
        }
    }
    assert( i == Vec_IntSize(vMain) );
    Vec_IntShrink( vMain, k );
}